

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small.c
# Opt level: O0

void small_stats(small_alloc *alloc,small_stats *totals,_func_int_void_ptr_void_ptr *cb,void *cb_ctx
                )

{
  int iVar1;
  undefined1 local_60 [8];
  mempool_stats stats;
  mempool *pool;
  mempool_iterator it;
  void *cb_ctx_local;
  _func_int_void_ptr_void_ptr *cb_local;
  small_stats *totals_local;
  small_alloc *alloc_local;
  
  it._8_8_ = cb_ctx;
  memset(totals,0,0x10);
  mempool_iterator_create((mempool_iterator *)&pool,alloc);
  do {
    stats.totals.total = (size_t)mempool_iterator_next((mempool_iterator *)&pool);
    if ((mempool *)stats.totals.total == (mempool *)0x0) {
      return;
    }
    mempool_stats((mempool *)stats.totals.total,(mempool_stats *)local_60);
    totals->used = stats._8_8_ + totals->used;
    totals->total = stats.totals.used + totals->total;
    iVar1 = (*cb)(local_60,(void *)it._8_8_);
  } while (iVar1 == 0);
  return;
}

Assistant:

void
small_stats(struct small_alloc *alloc,
	    struct small_stats *totals,
	    int (*cb)(const void *, void *), void *cb_ctx)
{
	memset(totals, 0, sizeof(*totals));

	struct mempool_iterator it;
	mempool_iterator_create(&it, alloc);
	struct mempool *pool;

	while ((pool = mempool_iterator_next(&it))) {
		struct mempool_stats stats;
		mempool_stats(pool, &stats);
		totals->used += stats.totals.used;
		totals->total += stats.totals.total;
		if (cb(&stats, cb_ctx))
			break;
	}
}